

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkStartReverseLevels(Abc_Ntk_t *pNtk,int nMaxLevelIncrease)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Ptr_t *__ptr;
  long lVar5;
  
  iVar2 = Abc_NtkLevel(pNtk);
  pNtk->LevelMax = iVar2 + nMaxLevelIncrease;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  pNtk->vLevelsR = pVVar3;
  iVar2 = pNtk->vObjs->nSize;
  uVar1 = iVar2 + 1;
  if (-1 < iVar2) {
    piVar4 = (int *)malloc((ulong)uVar1 * 4);
    pVVar3->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar3->nCap = uVar1;
    if (-1 < iVar2) {
      memset(pVVar3->pArray,0,(ulong)uVar1 << 2);
    }
  }
  pVVar3->nSize = uVar1;
  __ptr = Abc_NtkDfsReverse(pNtk);
  if (0 < __ptr->nSize) {
    lVar5 = 0;
    do {
      pObj = (Abc_Obj_t *)__ptr->pArray[lVar5];
      iVar2 = Abc_ObjReverseLevelNew(pObj);
      Abc_ObjSetReverseLevel(pObj,iVar2);
      lVar5 = lVar5 + 1;
    } while (lVar5 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Abc_NtkStartReverseLevels( Abc_Ntk_t * pNtk, int nMaxLevelIncrease )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    // remember the maximum number of direct levels
    pNtk->LevelMax = Abc_NtkLevel(pNtk) + nMaxLevelIncrease;
    // start the reverse levels
    pNtk->vLevelsR = Vec_IntAlloc( 0 );
    Vec_IntFill( pNtk->vLevelsR, 1 + Abc_NtkObjNumMax(pNtk), 0 );
    // compute levels in reverse topological order
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjSetReverseLevel( pObj, Abc_ObjReverseLevelNew(pObj) );
    Vec_PtrFree( vNodes );
}